

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O0

span<pstore::index::details::index_pointer,__1L> __thiscall
pstore::gsl::span<pstore::index::details::index_pointer,_-1L>::last
          (span<pstore::index::details::index_pointer,__1L> *this,index_type count)

{
  index_type iVar1;
  pointer peVar2;
  index_type count_local;
  span<pstore::index::details::index_pointer,__1L> *this_local;
  
  if (-1 < count) {
    iVar1 = size(this);
    if (count <= iVar1) {
      peVar2 = data(this);
      iVar1 = size(this);
      span((span<pstore::index::details::index_pointer,__1L> *)&this_local,peVar2 + (iVar1 - count),
           count);
      return (span<pstore::index::details::index_pointer,__1L>)_this_local;
    }
  }
  assert_failed("count >= 0 && count <= size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x16a);
}

Assistant:

span<element_type, dynamic_extent> last (index_type count) const {
                PSTORE_ASSERT (count >= 0 && count <= size ());
                return {data () + (size () - count), count};
            }